

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O0

bool __thiscall pg::DTLSolver::extractTangles(DTLSolver *this,int startvertex,bitset *R,int *str)

{
  int iVar1;
  unsigned_long *__first;
  uint64_t *puVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  uint uVar6;
  size_type sVar7;
  size_t sVar8;
  ostream *poVar9;
  Error *this_00;
  reference piVar10;
  uint *puVar11;
  iterator __first_00;
  iterator __last;
  reference ppiVar12;
  reference pvVar13;
  ulong uVar14;
  int iVar15;
  _label_vertex _Var16;
  byte local_4e3;
  bool local_4e2;
  bool local_4e1;
  iterator iStack_4d0;
  int v_6;
  iterator __end2_3;
  iterator __begin2_3;
  vector<int,_std::allocator<int>_> *__range2_3;
  value_type piStack_4b0;
  int c;
  int *_vv;
  int *_tout;
  uint x;
  int tidx;
  int local_490;
  _label_vertex local_488;
  Game *local_478;
  int local_470;
  _label_vertex local_468;
  int local_454;
  iterator iStack_450;
  int v_5;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  _label_vertex local_428;
  Game *local_418;
  int local_410;
  _label_vertex local_408;
  int *local_3f8;
  int *v_4;
  iterator __end5_1;
  iterator __begin5_1;
  vector<int,_std::allocator<int>_> *__range5_1;
  int i_1;
  int **_tv;
  iterator __end2_2;
  iterator __begin2_2;
  vector<int_*,_std::allocator<int_*>_> *__range2_2;
  bool already_exists;
  int tsize;
  undefined1 local_398 [16];
  undefined1 local_388 [28];
  int v_3;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  _label_vertex local_348;
  Game *local_338;
  int local_330;
  _label_vertex local_328;
  int local_314;
  iterator iStack_310;
  int v_2;
  iterator __end5;
  iterator __begin5;
  vector<int,_std::allocator<int>_> *__range5;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [28];
  int to_1;
  int *curedge;
  iterator iStack_2a0;
  int v_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  int local_274;
  iterator iStack_270;
  int v;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  uint local_250;
  uint uStack_24c;
  bool is_tangle;
  int t;
  undefined1 local_238 [16];
  undefined1 local_228 [24];
  undefined1 local_210 [4];
  int s;
  undefined1 local_200 [16];
  undefined1 local_1f0 [24];
  undefined1 local_1d8 [4];
  int to;
  int local_1c4;
  int *piStack_1c0;
  int w;
  int *edges;
  uint i;
  uint n;
  uint local_19c;
  uint local_198;
  int pl;
  int pr;
  bool new_tangles;
  int *str_local;
  bitset *R_local;
  DTLSolver *pDStack_178;
  int startvertex_local;
  DTLSolver *this_local;
  uintqueue *local_168;
  uint local_15c;
  uintqueue *local_158;
  uint local_14c;
  uintqueue *local_148;
  undefined4 local_13c;
  uintqueue *local_138;
  uint local_12c;
  uintqueue *local_128;
  undefined4 local_11c;
  uintqueue *local_118;
  uint local_10c;
  uintqueue *local_108;
  undefined4 local_fc;
  uintqueue *local_f8;
  uint local_ec;
  uintqueue *local_e8;
  uintqueue *local_e0;
  uintqueue *local_d8;
  uintqueue *local_d0;
  uintqueue *local_c8;
  uintqueue *local_c0;
  uintqueue *local_b8;
  uintqueue *local_b0;
  uintqueue *local_a8;
  uintqueue *local_a0;
  uintqueue *local_98;
  char local_89;
  bitset *local_88;
  uintqueue *local_80;
  uintqueue *local_70;
  uintqueue *local_68;
  uintqueue *local_60;
  uintqueue *local_58;
  uintqueue *local_50;
  uintqueue *local_48;
  uintqueue *local_40;
  uint local_34;
  uintqueue *local_30;
  undefined4 local_24;
  uintqueue *local_20;
  uint local_14;
  uintqueue *local_10;
  
  pl._3_1_ = 0;
  _pr = str;
  str_local = (int *)R;
  R_local._4_4_ = startvertex;
  pDStack_178 = this;
  local_198 = Solver::priority(&this->super_Solver,startvertex);
  local_19c = local_198 & 1;
  local_e8 = &this->pea_vS;
  local_ec = R_local._4_4_;
  iVar1 = (this->pea_vS).pointer;
  (this->pea_vS).pointer = iVar1 + 1;
  local_e8->queue[iVar1] = R_local._4_4_;
  local_f8 = &this->pea_iS;
  local_fc = 0;
  iVar1 = (this->pea_iS).pointer;
  (this->pea_iS).pointer = iVar1 + 1;
  local_f8->queue[iVar1] = 0;
  bitset::operator[]((bitset *)&i,(size_t)&this->pea_root);
  bitset::reference::operator=((reference *)&i,true);
  uVar6 = this->pea_curidx;
  this->pea_curidx = uVar6 + 1;
  this->pea_vidx[(int)R_local._4_4_] = uVar6;
LAB_00236455:
  do {
    local_d8 = &this->pea_vS;
    if ((this->pea_vS).pointer == 0) {
      (this->pea_S).pointer = 0;
      return (bool)(pl._3_1_ & 1);
    }
LAB_0023647c:
    while( true ) {
      local_b0 = &this->pea_vS;
      edges._4_4_ = local_b0->queue[(this->pea_vS).pointer + -1];
      local_b8 = &this->pea_iS;
      edges._0_4_ = local_b8->queue[(this->pea_iS).pointer + -1];
      uVar6 = Solver::owner(&this->super_Solver,edges._4_4_);
      if (uVar6 != local_19c) {
        piStack_1c0 = Solver::outs(&this->super_Solver,edges._4_4_);
        if (((uint)edges != 0) &&
           (local_1c4 = piStack_1c0[(uint)edges - 1],
           this->pea_vidx[local_1c4] < this->pea_vidx[edges._4_4_])) {
          this->pea_vidx[edges._4_4_] = this->pea_vidx[local_1c4];
          bitset::operator[]((bitset *)local_1d8,(size_t)&this->pea_root);
          bitset::reference::operator=((reference *)local_1d8,false);
        }
        do {
          local_1f0._20_4_ = piStack_1c0[(uint)edges];
          if (local_1f0._20_4_ == 0xffffffff) goto LAB_00236994;
          bitset::operator[]((bitset *)local_1f0,(size_t)str_local);
          bVar4 = bitset::reference::operator_cast_to_bool((reference *)local_1f0);
          if (bVar4) {
            if (this->pea_vidx[(int)local_1f0._20_4_] == 0) goto code_r0x00236624;
            if (this->pea_vidx[(int)local_1f0._20_4_] < this->pea_vidx[edges._4_4_]) {
              this->pea_vidx[edges._4_4_] = this->pea_vidx[(int)local_1f0._20_4_];
              bitset::operator[]((bitset *)local_210,(size_t)&this->pea_root);
              bitset::reference::operator=((reference *)local_210,false);
            }
          }
          edges._0_4_ = (uint)edges + 1;
        } while( true );
      }
      local_228._20_4_ = _pr[edges._4_4_];
      if (((uint)edges != 0) || (this->pea_vidx[(int)local_228._20_4_] != 0)) break;
      local_c8 = &this->pea_iS;
      local_c8->queue[(this->pea_iS).pointer + -1] = 1;
      local_128 = &this->pea_vS;
      iVar1 = (this->pea_vS).pointer;
      (this->pea_vS).pointer = iVar1 + 1;
      local_128->queue[iVar1] = local_228._20_4_;
      local_138 = &this->pea_iS;
      local_13c = 0;
      iVar1 = (this->pea_iS).pointer;
      (this->pea_iS).pointer = iVar1 + 1;
      local_138->queue[iVar1] = 0;
      local_12c = local_228._20_4_;
      bitset::operator[]((bitset *)local_228,(size_t)&this->pea_root);
      bitset::reference::operator=((reference *)local_228,true);
      uVar6 = this->pea_curidx;
      this->pea_curidx = uVar6 + 1;
      this->pea_vidx[(int)local_228._20_4_] = uVar6;
    }
    if (this->pea_vidx[(int)local_228._20_4_] < this->pea_vidx[edges._4_4_]) {
      this->pea_vidx[edges._4_4_] = this->pea_vidx[(int)local_228._20_4_];
      bitset::operator[]((bitset *)local_238,(size_t)&this->pea_root);
      bitset::reference::operator=((reference *)local_238,false);
    }
LAB_00236994:
    local_98 = &this->pea_vS;
    (this->pea_vS).pointer = (this->pea_vS).pointer + -1;
    local_a0 = &this->pea_iS;
    (this->pea_iS).pointer = (this->pea_iS).pointer + -1;
    bitset::operator[]((bitset *)&t,(size_t)&this->pea_root);
    bVar4 = bitset::reference::operator_cast_to_bool((reference *)&t);
    if (bVar4) {
      this->pea_curidx = this->pea_curidx + -1;
      uStack_24c = edges._4_4_;
      std::vector<int,_std::allocator<int>_>::push_back
                (&this->tangle,(value_type_conflict *)&stack0xfffffffffffffdb4);
      while (local_e0 = &this->pea_S, (this->pea_S).pointer != 0) {
        local_d0 = &this->pea_S;
        local_250 = local_d0->queue[(this->pea_S).pointer + -1];
        if (this->pea_vidx[(int)local_250] < this->pea_vidx[edges._4_4_]) break;
        local_a8 = &this->pea_S;
        (this->pea_S).pointer = (this->pea_S).pointer + -1;
        this->pea_curidx = this->pea_curidx + -1;
        this->pea_vidx[(int)local_250] = 0xffffffff;
        std::vector<int,_std::allocator<int>_>::push_back
                  (&this->tangle,(value_type_conflict *)&local_250);
      }
      this->pea_vidx[edges._4_4_] = 0xffffffff;
      sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->tangle);
      local_4e1 = true;
      if ((sVar7 < 2) && (local_4e1 = true, _pr[edges._4_4_] != edges._4_4_)) {
        local_4e2 = false;
        if (_pr[edges._4_4_] == -1) {
          local_4e2 = Game::has_edge((this->super_Solver).game,edges._4_4_,edges._4_4_);
        }
        local_4e1 = local_4e2;
      }
      if (local_4e1 == false) {
        std::vector<int,_std::allocator<int>_>::clear(&this->tangle);
      }
      else {
        __end2 = std::vector<int,_std::allocator<int>_>::begin(&this->tangle);
        iStack_270 = std::vector<int,_std::allocator<int>_>::end(&this->tangle);
        while (bVar4 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffd90), bVar4) {
          piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end2);
          local_274 = *piVar10;
          bitset::operator[]((bitset *)&__range2_1,(size_t)&this->escapes);
          bitset::reference::operator=((reference *)&__range2_1,true);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end2);
        }
        __end2_1 = std::vector<int,_std::allocator<int>_>::begin(&this->tangle);
        iStack_2a0 = std::vector<int,_std::allocator<int>_>::end(&this->tangle);
        while (bVar4 = __gnu_cxx::operator!=(&__end2_1,&stack0xfffffffffffffd60), bVar4) {
          piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end2_1);
          curedge._4_4_ = *piVar10;
          uVar6 = Solver::owner(&this->super_Solver,curedge._4_4_);
          if (uVar6 != local_19c) {
            for (register0x00000000 = (uint *)Solver::outs(&this->super_Solver,curedge._4_4_);
                *stack0xfffffffffffffd50 != 0xffffffff;
                register0x00000000 = stack0xfffffffffffffd50 + 1) {
              local_2c8._20_4_ = *stack0xfffffffffffffd50;
              bitset::operator[]((bitset *)local_2c8,(size_t)&this->G);
              bVar4 = bitset::reference::operator_cast_to_bool((reference *)local_2c8);
              local_4e3 = 0;
              if (bVar4) {
                bitset::operator[]((bitset *)local_2d8,(size_t)&this->escapes);
                bVar4 = bitset::reference::operator_cast_to_bool((reference *)local_2d8);
                local_4e3 = bVar4 ^ 0xff;
              }
              if ((local_4e3 & 1) != 0) {
                bitset::operator[]((bitset *)local_2e8,(size_t)&this->escapes);
                bitset::reference::operator=((reference *)local_2e8,true);
                local_158 = &this->tangleto;
                local_15c = local_2c8._20_4_;
                iVar1 = (this->tangleto).pointer;
                (this->tangleto).pointer = iVar1 + 1;
                local_158->queue[iVar1] = local_2c8._20_4_;
              }
            }
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end2_1);
        }
        local_88 = &this->escapes;
        __first = local_88->_bits;
        puVar2 = local_88->_bits;
        sVar8 = bitset::num_blocks(local_88);
        local_89 = '\0';
        std::fill<unsigned_long*,char>(__first,puVar2 + sVar8,&local_89);
        local_80 = &this->tangleto;
        if ((this->tangleto).pointer == 0) {
          if ((this->super_Solver).trace != 0) {
            poVar9 = std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;201mdominion \x1b[36m"
                                    );
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_198);
            std::operator<<(poVar9,"\x1b[m");
            poVar9 = std::operator<<((this->super_Solver).logger," (depth ");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->cur_depth);
            std::operator<<(poVar9,")");
            if (this->cur_depth != 0) {
              this_00 = (Error *)__cxa_allocate_exception(0x40);
              Error::Error(this_00,"logic error",
                           "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/dtl.cpp"
                           ,0x161);
              __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
            }
            if (1 < (this->super_Solver).trace) {
              __end5 = std::vector<int,_std::allocator<int>_>::begin(&this->tangle);
              iStack_310 = std::vector<int,_std::allocator<int>_>::end(&this->tangle);
              while (bVar4 = __gnu_cxx::operator!=(&__end5,&stack0xfffffffffffffcf0), bVar4) {
                piVar10 = __gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator*(&__end5);
                local_314 = *piVar10;
                poVar9 = std::operator<<((this->super_Solver).logger," \x1b[1;36m");
                _Var16 = Solver::label_vertex(&this->super_Solver,local_314);
                local_338 = _Var16.g;
                local_330 = _Var16.v;
                local_328.g = local_338;
                local_328.v = local_330;
                poVar9 = operator<<(poVar9,&local_328);
                std::operator<<(poVar9,"\x1b[m");
                if (_pr[local_314] != -1) {
                  poVar9 = std::operator<<((this->super_Solver).logger,"->");
                  _Var16 = Solver::label_vertex(&this->super_Solver,_pr[local_314]);
                  local_348.g = _Var16.g;
                  local_348.v = _Var16.v;
                  operator<<(poVar9,&local_348);
                }
                __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator++(&__end5);
              }
            }
            std::ostream::operator<<
                      ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
          }
          __end3 = std::vector<int,_std::allocator<int>_>::begin(&this->tangle);
          register0x00000000 = std::vector<int,_std::allocator<int>_>::end(&this->tangle);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                             *)(local_388 + 0x18)), bVar4) {
            puVar11 = (uint *)__gnu_cxx::
                              __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                              operator*(&__end3);
            local_388._20_4_ = *puVar11;
            bitset::operator[]((bitset *)local_388,(size_t)&this->S);
            bVar4 = bitset::reference::operator_cast_to_bool((reference *)local_388);
            if (!bVar4) {
              bitset::operator[]((bitset *)local_398,(size_t)&this->S);
              bitset::reference::operator=((reference *)local_398,true);
              local_168 = &this->SQ;
              this_local._4_4_ = local_388._20_4_;
              iVar1 = (this->SQ).pointer;
              (this->SQ).pointer = iVar1 + 1;
              local_168->queue[iVar1] = local_388._20_4_;
              std::vector<int,_std::allocator<int>_>::push_back
                        (&this->dom_vector,(value_type_conflict *)(local_388 + 0x14));
              std::vector<int,_std::allocator<int>_>::push_back
                        (&this->dom_vector,_pr + (int)local_388._20_4_);
            }
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end3);
          }
          this->dominions = this->dominions + 1;
          std::vector<int,_std::allocator<int>_>::clear(&this->tangle);
          pl._3_1_ = 1;
        }
        else {
          __first_00 = std::vector<int,_std::allocator<int>_>::begin(&this->tangle);
          __last = std::vector<int,_std::allocator<int>_>::end(&this->tangle);
          std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     __first_00._M_current,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     __last._M_current);
          sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->tangle);
          bVar4 = false;
          __end2_2 = std::vector<int_*,_std::allocator<int_*>_>::begin(&this->tv);
          _tv = (int **)std::vector<int_*,_std::allocator<int_*>_>::end(&this->tv);
          while (bVar5 = __gnu_cxx::operator!=
                                   (&__end2_2,
                                    (__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>
                                     *)&_tv), bVar5) {
            ppiVar12 = __gnu_cxx::
                       __normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>::
                       operator*(&__end2_2);
            for (__range5_1._4_4_ = 0; __range5_1._4_4_ != (int)sVar7;
                __range5_1._4_4_ = __range5_1._4_4_ + 1) {
              iVar1 = (*ppiVar12)[__range5_1._4_4_ << 1];
              pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&this->tangle,(long)__range5_1._4_4_);
              if (iVar1 != *pvVar13) goto LAB_002374ea;
            }
            if ((*ppiVar12)[__range5_1._4_4_ << 1] == -1) {
              bVar4 = true;
            }
LAB_002374ea:
            if (bVar4) break;
            __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>::
            operator++(&__end2_2);
          }
          if (bVar4) {
            if (0 < (this->super_Solver).trace) {
              std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;198mduplicate tangle\x1b[m");
              if (1 < (this->super_Solver).trace) {
                __end5_1 = std::vector<int,_std::allocator<int>_>::begin(&this->tangle);
                v_4 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->tangle);
                while (bVar4 = __gnu_cxx::operator!=
                                         (&__end5_1,
                                          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                           *)&v_4), bVar4) {
                  local_3f8 = __gnu_cxx::
                              __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                              operator*(&__end5_1);
                  poVar9 = std::operator<<((this->super_Solver).logger," \x1b[1;36m");
                  _Var16 = Solver::label_vertex(&this->super_Solver,*local_3f8);
                  local_418 = _Var16.g;
                  local_410 = _Var16.v;
                  local_408.g = local_418;
                  local_408.v = local_410;
                  poVar9 = operator<<(poVar9,&local_408);
                  std::operator<<(poVar9,"\x1b[m");
                  if (_pr[*local_3f8] != -1) {
                    poVar9 = std::operator<<((this->super_Solver).logger,"->");
                    _Var16 = Solver::label_vertex(&this->super_Solver,_pr[*local_3f8]);
                    local_428.g = _Var16.g;
                    local_428.v = _Var16.v;
                    operator<<(poVar9,&local_428);
                  }
                  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator++(&__end5_1);
                }
              }
              std::ostream::operator<<
                        ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
            }
            std::vector<int,_std::allocator<int>_>::clear(&this->tangle);
            local_68 = &this->tangleto;
            (this->tangleto).pointer = 0;
          }
          else {
            if (0 < (this->super_Solver).trace) {
              poVar9 = std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;198mnew tangle ");
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_198);
              poVar9 = std::operator<<(poVar9,"\x1b[m (");
              sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->tpr);
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar7);
              std::operator<<(poVar9,")");
              poVar9 = std::operator<<((this->super_Solver).logger," (depth ");
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->cur_depth);
              std::operator<<(poVar9,")");
              if (1 < (this->super_Solver).trace) {
                __end4 = std::vector<int,_std::allocator<int>_>::begin(&this->tangle);
                iStack_450 = std::vector<int,_std::allocator<int>_>::end(&this->tangle);
                while (bVar4 = __gnu_cxx::operator!=(&__end4,&stack0xfffffffffffffbb0), bVar4) {
                  piVar10 = __gnu_cxx::
                            __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                            operator*(&__end4);
                  local_454 = *piVar10;
                  poVar9 = std::operator<<((this->super_Solver).logger," \x1b[1;36m");
                  _Var16 = Solver::label_vertex(&this->super_Solver,local_454);
                  local_478 = _Var16.g;
                  local_470 = _Var16.v;
                  local_468.g = local_478;
                  local_468.v = local_470;
                  poVar9 = operator<<(poVar9,&local_468);
                  std::operator<<(poVar9,"\x1b[m");
                  if (_pr[local_454] != -1) {
                    poVar9 = std::operator<<((this->super_Solver).logger,"->");
                    _Var16 = Solver::label_vertex(&this->super_Solver,_pr[local_454]);
                    _x = _Var16.g;
                    local_490 = _Var16.v;
                    local_488.g = _x;
                    local_488.v = local_490;
                    operator<<(poVar9,&local_488);
                  }
                  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator++(&__end4);
                }
              }
              poVar9 = std::operator<<((this->super_Solver).logger," with ");
              local_40 = &this->tangleto;
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,(this->tangleto).pointer);
              std::operator<<(poVar9," escape vertices.");
              std::ostream::operator<<
                        ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
            }
            sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->tpr);
            _tout._4_4_ = (undefined4)sVar7;
            for (_tout._0_4_ = 0; local_48 = &this->tangleto,
                (uint)_tout < (uint)(this->tangleto).pointer; _tout._0_4_ = (uint)_tout + 1) {
              local_10 = &this->tangleto;
              local_14 = (uint)_tout;
              std::vector<int,_std::allocator<int>_>::push_back
                        (this->tin + local_10->queue[(uint)_tout],
                         (value_type_conflict *)((long)&_tout + 4));
            }
            local_50 = &this->tangleto;
            auVar3 = ZEXT416((this->tangleto).pointer + 1) * ZEXT816(4);
            uVar14 = auVar3._0_8_;
            if (auVar3._8_8_ != 0) {
              uVar14 = 0xffffffffffffffff;
            }
            _vv = (int *)operator_new__(uVar14);
            local_20 = &this->tangleto;
            local_24 = 0;
            local_30 = &this->tangleto;
            local_58 = &this->tangleto;
            local_34 = (this->tangleto).pointer;
            std::copy<unsigned_int*,int*>(local_20->queue,local_30->queue + local_34,_vv);
            local_60 = &this->tangleto;
            _vv[(uint)(this->tangleto).pointer] = -1;
            std::vector<int_*,_std::allocator<int_*>_>::push_back(&this->tout,&_vv);
            sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->tangle);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = sVar7 * 2 + 1;
            uVar14 = SUB168(auVar3 * ZEXT816(4),0);
            if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
              uVar14 = 0xffffffffffffffff;
            }
            piStack_4b0 = (value_type)operator_new__(uVar14);
            __range2_3._4_4_ = 0;
            __end2_3 = std::vector<int,_std::allocator<int>_>::begin(&this->tangle);
            iStack_4d0 = std::vector<int,_std::allocator<int>_>::end(&this->tangle);
            while (bVar4 = __gnu_cxx::operator!=(&__end2_3,&stack0xfffffffffffffb30), bVar4) {
              piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator*(&__end2_3);
              iVar1 = *piVar10;
              iVar15 = __range2_3._4_4_ + 1;
              piStack_4b0[__range2_3._4_4_] = iVar1;
              __range2_3._4_4_ = __range2_3._4_4_ + 2;
              piStack_4b0[iVar15] = _pr[iVar1];
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&__end2_3);
            }
            piStack_4b0[__range2_3._4_4_] = -1;
            std::vector<int_*,_std::allocator<int_*>_>::push_back
                      (&this->tv,&stack0xfffffffffffffb50);
            std::vector<int,_std::allocator<int>_>::push_back
                      (&this->tpr,(value_type_conflict *)&local_198);
            this->tangles = this->tangles + 1;
            pl._3_1_ = 1;
            std::vector<int,_std::allocator<int>_>::clear(&this->tangle);
            local_70 = &this->tangleto;
            (this->tangleto).pointer = 0;
          }
        }
      }
      goto LAB_00236455;
    }
    local_148 = &this->pea_S;
    local_14c = edges._4_4_;
    iVar1 = (this->pea_S).pointer;
    (this->pea_S).pointer = iVar1 + 1;
    local_148->queue[iVar1] = edges._4_4_;
  } while( true );
code_r0x00236624:
  local_c0 = &this->pea_iS;
  local_c0->queue[(this->pea_iS).pointer + -1] = (uint)edges + 1;
  local_108 = &this->pea_vS;
  local_10c = local_1f0._20_4_;
  iVar1 = (this->pea_vS).pointer;
  (this->pea_vS).pointer = iVar1 + 1;
  local_108->queue[iVar1] = local_1f0._20_4_;
  local_118 = &this->pea_iS;
  local_11c = 0;
  iVar1 = (this->pea_iS).pointer;
  (this->pea_iS).pointer = iVar1 + 1;
  local_118->queue[iVar1] = 0;
  bitset::operator[]((bitset *)local_200,(size_t)&this->pea_root);
  bitset::reference::operator=((reference *)local_200,true);
  uVar6 = this->pea_curidx;
  this->pea_curidx = uVar6 + 1;
  this->pea_vidx[(int)local_1f0._20_4_] = uVar6;
  goto LAB_0023647c;
}

Assistant:

bool
DTLSolver::extractTangles(int startvertex, bitset &R, int *str)
{
    bool new_tangles = false;
    const int pr = priority(startvertex);
    const int pl = pr&1;

    /**
     * The following is the nonrecursive implementation of David Pearce,
     * "A space-efficient algorithm for finding strongly connected components" (IPL, 2016),
     * modified to on-the-fly restrict the graph by <R> and <str>.
     */

    // beginVisiting
    pea_vS.push(startvertex);
    pea_iS.push(0);
    pea_root[startvertex] = true;
    pea_vidx[startvertex] = pea_curidx++;
    while (pea_vS.nonempty()) {
pearce_again:
        // visitLoop
        const unsigned int n = pea_vS.back();
        unsigned int i = pea_iS.back();

        if (owner(n) != pl) {
            auto edges = outs(n);
            if (i>0) {
                // finishEdge
                const int w = edges[i-1];
                if (pea_vidx[w] < pea_vidx[n]) {
                    pea_vidx[n] = pea_vidx[w];
                    pea_root[n] = false;
                }
            }
            for (;;) {
                const int to = edges[i];
                if (to == -1) break; // done
                // beginEdge
                if (R[to]) {
                    if (pea_vidx[to] == 0) {
                        pea_iS.back() = i+1;
                        // beginVisiting
                        pea_vS.push(to);
                        pea_iS.push(0);
                        pea_root[to] = true;
                        pea_vidx[to] = pea_curidx++;
                        goto pearce_again; // break; continue;
                    } else {
                        // finishEdge
                        if (pea_vidx[to] < pea_vidx[n]) {
                            pea_vidx[n] = pea_vidx[to];
                            pea_root[n] = false;
                        }
                    }
                }
                i++;
            }
        } else {
            const int s = str[n];
            if (i == 0) {
                // beginEdge
                if (pea_vidx[s] == 0) {
                    pea_iS.back() = 1;
                    // beginVisiting
                    pea_vS.push(s);
                    pea_iS.push(0);
                    pea_root[s] = true;
                    pea_vidx[s] = pea_curidx++;
                    goto pearce_again; // break; continue;
                }
            }
            // finishEdge
            if (pea_vidx[s] < pea_vidx[n]) {
                pea_vidx[n] = pea_vidx[s];
                pea_root[n] = false;
            }
        }
        // finishVisiting
        pea_vS.pop();
        pea_iS.pop();
        if (pea_root[n]) {
            pea_curidx -= 1;
            tangle.push_back(n);
            while (pea_S.nonempty()) {
                const int t = pea_S.back();
                if (pea_vidx[n]>pea_vidx[t]) break;
                pea_S.pop();
                pea_curidx -= 1;
                pea_vidx[t] = (unsigned int)-1;
                tangle.push_back(t);
            }
            pea_vidx[n] = (unsigned int)-1;
        } else {
            pea_S.push(n);
            continue;
        }

        /**
         * End of Pearce's algorithm.
         * At this point, we have an SCC in <tangle>.
         *
         * Now check if the SCC is nontrivial, i.e., contains a cycle, i.e., either 2+ vertices
         * or a self-loop.
         */

        const bool is_tangle = (tangle.size() > 1) or
            ((unsigned int)str[n] == n) or
            (str[n] == -1 and game.has_edge(n, n));
        if (!is_tangle) {
            tangle.clear();
            continue;
        }

        /**
         * We have a tangle. Compute the outgoing edges (into <tangleto>) and the next highest region.
         */

        for (const int v : tangle) escapes[v] = true;

        for (const int v : tangle) {
            if (owner(v) != pl) {
                for (auto curedge = outs(v); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (G[to] and !escapes[to]) {
                        escapes[to] = true;
                        tangleto.push(to);
                    }
                }
            }
        }

        escapes.reset();

        /**
         * If there are no outgoing edges, then we have found a dominion.
         */

        if (tangleto.empty()) {
            // dominion
            if (trace) {
                logger << "\033[1;38;5;201mdominion \033[36m" << pr << "\033[m";
                logger << " (depth " << cur_depth <<")";
                if (cur_depth != 0) {
                    LOGIC_ERROR;
                    exit(-1);
                }
#ifndef NDEBUG
                if (trace >= 2) {
                    for (const int v : tangle) {
                        logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                        if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                    }
                }
#endif
                logger << std::endl;
            }
            for (const int v : tangle) {
                // if not yet added to solve queue, mark and add it
                if (S[v] == false) {
                    S[v] = true;
                    SQ.push(v);
                    dom_vector.push_back(v);
                    dom_vector.push_back(str[v]);
                }
            }
            dominions++;
            tangle.clear();
            new_tangles = true;
            continue;
        }

        /**
         * We're not a dominion, we're a tangle.
         */

#if CHECK_UNIQUE
        /** 
         * First we sort.
         */
        std::sort(tangle.begin(), tangle.end());
        int tsize = tangle.size();

        /**
         * Then we check if it already exists.
         */
        bool already_exists = false;
        for (auto &_tv : tv) {
            for (int i=0; ; i++) {
                if (i == tsize) {
                    if (_tv[2*i] == -1) already_exists = true;
                    break;
                } else if (_tv[2*i] != tangle[i]) {
                    break;
                }
            }
            if (already_exists) break;
        }
        if (already_exists) {
            if (trace >= 1) {
                logger << "\033[1;38;5;198mduplicate tangle\033[m";
#ifndef NDEBUG
                if (trace >= 2) {
                    for (int &v : tangle) {
                        logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                        if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                    }
                }
#endif
                logger << std::endl;
            }
            tangle.clear();
            tangleto.clear();
            continue;
        }
#endif

        if (trace >= 1) {
            logger << "\033[1;38;5;198mnew tangle " << pr << "\033[m (" << tpr.size() << ")";
            logger << " (depth " << cur_depth <<")";
            if (trace >= 2) {
                for (const int v : tangle) {
                    logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                    if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                }
            }
            logger << " with " << tangleto.size() << " escape vertices.";
            logger << std::endl;
        }

        // new tangle idx
        const int tidx = tpr.size();

        // add back links to all normal vertices in our [out]
        for (unsigned int x = 0; x < tangleto.size(); x++) tin[tangleto[x]].push_back(tidx);

        // move tangleto into vout
        int* _tout = new int[tangleto.size()+1];
        std::copy(&tangleto[0], &tangleto[tangleto.size()], _tout);
        _tout[tangleto.size()] = -1;
        tout.push_back(_tout);

        // move tangle into vv
        int* _vv = new int[tangle.size()*2+1], c=0;
        for (const int v : tangle) {
            _vv[c++] = v;
            _vv[c++] = str[v];
        }
        _vv[c] = -1;
        tv.push_back(_vv);

        // and set p to pr
        tpr.push_back(pr);

        tangles++;
        new_tangles = true;
        tangle.clear();
        tangleto.clear();
    }

    pea_S.clear();
    return new_tangles;
}